

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

uint gcd(uint a,uint b)

{
  uint t;
  uint uVar1;
  
  uVar1 = a;
  if (b != 0) {
    do {
      uVar1 = b;
      b = a % uVar1;
      a = uVar1;
    } while (b != 0);
  }
  return uVar1;
}

Assistant:

unsigned int gcd(unsigned int a, unsigned int b)
{
	/* Use the division-based version of Euclid's algorithm. */
	while (b) {
		unsigned int t = b;

		b = a % b;
		a = t;
	}
	return a;
}